

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O2

void Js::JavascriptBigInt::AddAbsolute(JavascriptBigInt *pbi1,JavascriptBigInt *pbi2)

{
  ulong *puVar1;
  unsigned_long *puVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  unsigned_long *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  unsigned_long uVar10;
  bool bVar11;
  
  if (pbi1->m_length < pbi2->m_length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0x1c4,"(pbi1->m_length >= pbi2->m_length)",
                                "pbi1->m_length >= pbi2->m_length");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  puVar6 = (pbi1->m_digits).ptr;
  puVar2 = (pbi2->m_digits).ptr;
  uVar8 = 0;
  for (uVar7 = 0; uVar7 < pbi2->m_length; uVar7 = uVar7 + 1) {
    uVar9 = puVar2[uVar7];
    bVar4 = CARRY8(uVar9,puVar6[uVar7]);
    uVar9 = uVar9 + puVar6[uVar7];
    bVar11 = CARRY8(uVar9,uVar8);
    uVar10 = uVar9 + uVar8;
    uVar8 = (ulong)bVar4 + 1;
    if (!bVar11) {
      uVar8 = (ulong)bVar4;
    }
    puVar6[uVar7] = uVar10;
  }
  for (; (uVar9 = pbi1->m_length, uVar7 < uVar9 && (uVar8 != 0)); uVar8 = (ulong)CARRY8(uVar9,uVar8)
      ) {
    puVar1 = puVar6 + uVar7;
    uVar9 = *puVar1;
    *puVar1 = *puVar1 + uVar8;
    uVar7 = uVar7 + 1;
  }
  if (uVar8 != 0) {
    if (pbi1->m_maxLength <= uVar9) {
      Resize(pbi1,uVar9 + 1);
      puVar6 = (pbi1->m_digits).ptr;
      uVar9 = pbi1->m_length;
    }
    pbi1->m_length = uVar9 + 1;
    puVar6[uVar9] = uVar8;
  }
  return;
}

Assistant:

void JavascriptBigInt::AddAbsolute(JavascriptBigInt * pbi1, JavascriptBigInt * pbi2)
    {
        Assert(pbi1->m_length >= pbi2->m_length);
        digit_t carryDigit = 0;
        digit_t *pDigit1 = pbi1->m_digits;
        digit_t *pDigit2 = pbi2->m_digits;
        digit_t i = 0;

        for (; i < pbi2->m_length; i++)
        {
            digit_t tempCarryDigit = 0;
            pDigit1[i] = JavascriptBigInt::AddDigit(pDigit1[i], pDigit2[i], &tempCarryDigit);
            pDigit1[i] = JavascriptBigInt::AddDigit(pDigit1[i], carryDigit, &tempCarryDigit);
            carryDigit = tempCarryDigit;
        }

        for (; i < pbi1->m_length && carryDigit > 0; i++)
        {
            digit_t tempCarryDigit = 0;
            pDigit1[i] = JavascriptBigInt::AddDigit(pDigit1[i], carryDigit, &tempCarryDigit);
            carryDigit = tempCarryDigit;
        }

        if (0 < carryDigit) // length increase by 1
        {
            if (pbi1->m_length >= pbi1->m_maxLength)
            {
                pbi1->Resize(pbi1->m_length + 1);
            }
            pbi1->m_digits[pbi1->m_length++] = carryDigit;
        }
    }